

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O0

const_iterator __thiscall
QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
::find(QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
       *this,DBusKey *key)

{
  long lVar1;
  bool bVar2;
  QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
  *in_RSI;
  long in_FS_OFFSET;
  const_iterator it;
  DBusKey *in_stack_ffffffffffffff98;
  const_iterator *in_stack_ffffffffffffffa0;
  QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
  *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffc8 [16];
  const_iterator local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = lower_bound(in_stack_ffffffffffffffc8._8_8_,in_stack_ffffffffffffffc8._0_8_);
  end(in_stack_ffffffffffffffa8);
  bVar2 = const_iterator::operator!=
                    (in_stack_ffffffffffffffa0,(const_iterator *)in_stack_ffffffffffffff98);
  if (bVar2) {
    const_iterator::key((const_iterator *)0xb26513);
    bVar2 = std::less<QDBusListener::DBusKey>::operator()
                      ((less<QDBusListener::DBusKey> *)in_stack_ffffffffffffffa0,
                       in_stack_ffffffffffffff98,(DBusKey *)0xb26525);
    if (bVar2) {
      local_18 = end(in_RSI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

const_iterator find(const Key &key) const
    {
        auto it = lower_bound(key);
        if (it != end()) {
            if (!key_compare::operator()(key, it.key()))
                return it;
            it = end();
        }
        return it;
    }